

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O1

int N_VLinearCombinationVectorArray_Serial(int nvec,int nsum,realtype *c,N_Vector **X,N_Vector *Z)

{
  realtype rVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  int iVar5;
  N_Vector *pp_Var6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  long lVar14;
  
  if (nsum < 1 || nvec < 1) {
    return -1;
  }
  uVar3 = (ulong)(uint)nsum;
  if (nvec == 1) {
    if (nsum == 2) {
      N_VLinearSum_Serial(*c,**X,c[1],*X[1],*Z);
      return 0;
    }
    if (nsum == 1) {
      N_VScale_Serial(*c,**X,*Z);
      return 0;
    }
    pp_Var6 = (N_Vector *)malloc(uVar3 * 8);
    if (0 < nsum) {
      uVar7 = 0;
      do {
        pp_Var6[uVar7] = *X[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar3 != uVar7);
    }
    iVar5 = N_VLinearCombination_Serial(nsum,c,pp_Var6,*Z);
  }
  else {
    if (nsum == 2) {
      iVar5 = N_VLinearSumVectorArray_Serial(nvec,*c,*X,c[1],X[1],Z);
      return iVar5;
    }
    if (nsum != 1) {
      uVar2 = *(*Z)->content;
      uVar7 = (ulong)uVar2;
      pp_Var6 = *X;
      if (pp_Var6 == Z) {
        if ((*c == 1.0) && (!NAN(*c))) {
          if (nvec < 1) {
            return 0;
          }
          uVar9 = 0;
          do {
            if (1 < nsum) {
              lVar8 = *(long *)((long)Z[uVar9]->content + 8);
              uVar10 = 1;
              do {
                if (0 < (int)uVar2) {
                  lVar14 = *(long *)((long)X[uVar10][uVar9]->content + 8);
                  uVar11 = 0;
                  do {
                    *(double *)(lVar8 + uVar11 * 8) =
                         c[uVar10] * *(double *)(lVar14 + uVar11 * 8) +
                         *(double *)(lVar8 + uVar11 * 8);
                    uVar11 = uVar11 + 1;
                  } while (uVar7 != uVar11);
                }
                uVar10 = uVar10 + 1;
              } while (uVar10 != uVar3);
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != (uint)nvec);
          return 0;
        }
        if (pp_Var6 == Z) {
          if (nvec < 1) {
            return 0;
          }
          uVar9 = 0;
          do {
            lVar8 = *(long *)((long)Z[uVar9]->content + 8);
            if (0 < (int)uVar2) {
              uVar10 = 0;
              do {
                *(double *)(lVar8 + uVar10 * 8) = *c * *(double *)(lVar8 + uVar10 * 8);
                uVar10 = uVar10 + 1;
              } while (uVar7 != uVar10);
            }
            if (1 < nsum) {
              uVar10 = 1;
              do {
                if (0 < (int)uVar2) {
                  lVar14 = *(long *)((long)X[uVar10][uVar9]->content + 8);
                  uVar11 = 0;
                  do {
                    *(double *)(lVar8 + uVar11 * 8) =
                         c[uVar10] * *(double *)(lVar14 + uVar11 * 8) +
                         *(double *)(lVar8 + uVar11 * 8);
                    uVar11 = uVar11 + 1;
                  } while (uVar7 != uVar11);
                }
                uVar10 = uVar10 + 1;
              } while (uVar10 != uVar3);
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != (uint)nvec);
          return 0;
        }
      }
      if (0 < nvec) {
        uVar9 = 0;
        do {
          lVar8 = *(long *)((long)Z[uVar9]->content + 8);
          if (0 < (int)uVar2) {
            lVar14 = *(long *)((long)pp_Var6[uVar9]->content + 8);
            uVar10 = 0;
            do {
              *(double *)(lVar8 + uVar10 * 8) = *c * *(double *)(lVar14 + uVar10 * 8);
              uVar10 = uVar10 + 1;
            } while (uVar7 != uVar10);
          }
          if (1 < nsum) {
            uVar10 = 1;
            do {
              if (0 < (int)uVar2) {
                lVar14 = *(long *)((long)X[uVar10][uVar9]->content + 8);
                uVar11 = 0;
                do {
                  *(double *)(lVar8 + uVar11 * 8) =
                       c[uVar10] * *(double *)(lVar14 + uVar11 * 8) +
                       *(double *)(lVar8 + uVar11 * 8);
                  uVar11 = uVar11 + 1;
                } while (uVar7 != uVar11);
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 != uVar3);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != (uint)nvec);
      }
      return 0;
    }
    pp_Var6 = (N_Vector *)malloc((ulong)(uint)nvec * 8);
    auVar4 = _DAT_006979c0;
    if (0 < nvec) {
      rVar1 = *c;
      lVar8 = (ulong)(uint)nvec - 1;
      auVar12._8_4_ = (int)lVar8;
      auVar12._0_8_ = lVar8;
      auVar12._12_4_ = (int)((ulong)lVar8 >> 0x20);
      lVar8 = 0;
      auVar12 = auVar12 ^ _DAT_006979c0;
      auVar13 = _DAT_006979b0;
      do {
        auVar15 = auVar13 ^ auVar4;
        if ((bool)(~(auVar15._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar15._0_4_ ||
                    auVar12._4_4_ < auVar15._4_4_) & 1)) {
          *(realtype *)((long)pp_Var6 + lVar8) = rVar1;
        }
        if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
            auVar15._12_4_ <= auVar12._12_4_) {
          *(realtype *)((long)pp_Var6 + lVar8 + 8) = rVar1;
        }
        lVar14 = auVar13._8_8_;
        auVar13._0_8_ = auVar13._0_8_ + 2;
        auVar13._8_8_ = lVar14 + 2;
        lVar8 = lVar8 + 0x10;
      } while ((ulong)(nvec + 1U >> 1) << 4 != lVar8);
    }
    iVar5 = N_VScaleVectorArray_Serial(nvec,(realtype *)pp_Var6,*X,Z);
  }
  free(pp_Var6);
  return iVar5;
}

Assistant:

int N_VLinearCombinationVectorArray_Serial(int nvec, int nsum, realtype* c,
                                           N_Vector** X, N_Vector* Z)
{
  int          i; /* vector arrays index in summation [0,nsum) */
  int          j; /* vector index in vector array     [0,nvec) */
  sunindextype k; /* element index in vector          [0,N)    */
  sunindextype N;
  realtype*    zd=NULL;
  realtype*    xd=NULL;

  int          retval;
  realtype*    ctmp;
  N_Vector*   Y;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);
  if (nsum < 1) return(-1);

  /* ---------------------------
   * Special cases for nvec == 1
   * --------------------------- */

  if (nvec == 1) {

    /* should have called N_VScale */
    if (nsum == 1) {
      N_VScale_Serial(c[0], X[0][0], Z[0]);
      return(0);
    }

    /* should have called N_VLinearSum */
    if (nsum == 2) {
      N_VLinearSum_Serial(c[0], X[0][0], c[1], X[1][0], Z[0]);
      return(0);
    }

    /* should have called N_VLinearCombination */
    Y = (N_Vector*) malloc(nsum * sizeof(N_Vector));

    for (i=0; i<nsum; i++) {
      Y[i] = X[i][0];
    }

    retval = N_VLinearCombination_Serial(nsum, c, Y, Z[0]);

    free(Y);
    return(retval);
  }

  /* --------------------------
   * Special cases for nvec > 1
   * -------------------------- */

  /* should have called N_VScaleVectorArray */
  if (nsum == 1) {

    ctmp = (realtype*) malloc(nvec * sizeof(realtype));

    for (j=0; j<nvec; j++) {
      ctmp[j] = c[0];
    }

    retval = N_VScaleVectorArray_Serial(nvec, ctmp, X[0], Z);

    free(ctmp);
    return(retval);
  }

  /* should have called N_VLinearSumVectorArray */
  if (nsum == 2) {
    retval = N_VLinearSumVectorArray_Serial(nvec, c[0], X[0], c[1], X[1], Z);
    return(retval);
  }

  /* --------------------------
   * Compute linear combination
   * -------------------------- */

  /* get vector length */
  N = NV_LENGTH_S(Z[0]);

  /*
   * X[0][j] += c[i]*X[i][j], i = 1,...,nvec-1
   */
  if ((X[0] == Z) && (c[0] == ONE)) {
    for (j=0; j<nvec; j++) {
      zd = NV_DATA_S(Z[j]);
      for (i=1; i<nsum; i++) {
        xd = NV_DATA_S(X[i][j]);
        for (k=0; k<N; k++) {
          zd[k] += c[i] * xd[k];
        }
      }
    }
    return(0);
  }

  /*
   * X[0][j] = c[0] * X[0][j] + sum{ c[i] * X[i][j] }, i = 1,...,nvec-1
   */
  if (X[0] == Z) {
    for (j=0; j<nvec; j++) {
      zd = NV_DATA_S(Z[j]);
      for (k=0; k<N; k++) {
        zd[k] *= c[0];
      }
      for (i=1; i<nsum; i++) {
        xd = NV_DATA_S(X[i][j]);
        for (k=0; k<N; k++) {
          zd[k] += c[i] * xd[k];
        }
      }
    }
    return(0);
  }

  /*
   * Z[j] = sum{ c[i] * X[i][j] }, i = 0,...,nvec-1
   */
  for (j=0; j<nvec; j++) {
    xd = NV_DATA_S(X[0][j]);
    zd = NV_DATA_S(Z[j]);
    for (k=0; k<N; k++) {
      zd[k] = c[0] * xd[k];
    }
    for (i=1; i<nsum; i++) {
      xd = NV_DATA_S(X[i][j]);
      for (k=0; k<N; k++) {
        zd[k] += c[i] * xd[k];
      }
    }
  }
  return(0);
}